

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brecovery.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pthread_mutex_t *ppVar1;
  uint64_t uVar2;
  atomic<unsigned_long> aVar3;
  unsigned_long uVar4;
  pointer pRVar5;
  bool bVar6;
  cx_string<2UL> cVar7;
  int iVar8;
  size_t sVar9;
  long *plVar10;
  size_t sVar11;
  SessionWriter *pSVar12;
  __atomic_base<unsigned_long> _Var13;
  Session *pSVar14;
  undefined8 uVar15;
  ulong uVar16;
  long lVar17;
  char *pcVar18;
  RecoveredBuffer *name;
  __normal_iterator<RecoveredBuffer_*,_std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>_>
  __i;
  long lVar19;
  RecoveredBuffer *pRVar20;
  RecoveredBuffer *pRVar21;
  pointer pRVar22;
  long *in_FS_OFFSET;
  timespec ts_1;
  size_t size;
  streamoff afterMagicPos;
  vector<char,_std::allocator<char>_> metadata;
  vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_> buffers;
  uintptr_t session;
  void *sessionptr;
  size_t offset;
  array<unsigned_char,_8UL> dataMagic;
  array<unsigned_char,_8UL> metadataMagic;
  string outputPath;
  ofstream outputFile;
  ifstream input;
  undefined1 local_1218 [32];
  pointer local_11f8;
  RecoveredBuffer *local_11e8;
  SessionWriter *local_11e0;
  undefined1 local_11d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_11b8;
  _Alloc_hider local_11a8;
  size_type local_11a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1198;
  _Alloc_hider local_1188;
  pointer local_1180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1178;
  uint64_t local_1168;
  _Alloc_hider local_1160;
  pointer local_1158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1150;
  _Alloc_hider local_1140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1130;
  unsigned_long local_1120;
  cx_string<1UL> local_1114;
  cx_string<1UL> local_1112;
  long local_1110;
  vector<char,_std::allocator<char>_> local_1108;
  char *local_10e8;
  char *local_10e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10b8;
  undefined4 local_10b0;
  undefined4 uStack_10ac;
  vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_> local_10a8;
  undefined1 *local_1088;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1080;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1078;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1070;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1068;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1060;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1058;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1050;
  code *local_1048;
  undefined1 local_1040 [16];
  undefined1 local_1030 [152];
  _Alloc_hider local_f98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f88;
  undefined1 local_f78 [152];
  _Alloc_hider local_ee0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ed0;
  undefined1 local_ec0 [16];
  _Alloc_hider local_eb0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ea0;
  _Alloc_hider local_e90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e80;
  _Alloc_hider local_e70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e60;
  uint64_t local_e50;
  _Alloc_hider local_e48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e38;
  _Alloc_hider local_e28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e18;
  undefined1 *local_e08;
  undefined1 *local_e00;
  string *local_df8;
  string *local_df0;
  string *local_de8;
  string *local_de0;
  string *local_dd8;
  string *local_dd0;
  string *local_dc8;
  long local_dc0;
  long local_db8;
  undefined1 local_db0 [16];
  _Alloc_hider local_da0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d90;
  _Alloc_hider local_d80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d70;
  _Alloc_hider local_d60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d50;
  uint64_t local_d40;
  _Alloc_hider local_d38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d28;
  _Alloc_hider local_d18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d08;
  undefined1 local_cf8 [16];
  _Alloc_hider local_ce8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_cd8;
  _Alloc_hider local_cc8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_cb8;
  _Alloc_hider local_ca8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c98;
  uint64_t local_c88;
  _Alloc_hider local_c80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c70;
  _Alloc_hider local_c60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c50;
  undefined1 local_c40 [16];
  _Alloc_hider local_c30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c20;
  _Alloc_hider local_c10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c00;
  _Alloc_hider local_bf0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_be0;
  uint64_t local_bd0;
  _Alloc_hider local_bc8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bb8;
  _Alloc_hider local_ba8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b98;
  undefined1 local_b88 [16];
  _Alloc_hider local_b78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b68;
  _Alloc_hider local_b58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b48;
  _Alloc_hider local_b38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b28;
  uint64_t local_b18;
  _Alloc_hider local_b10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b00;
  _Alloc_hider local_af0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ae0;
  long *local_ad0 [2];
  long local_ac0 [2];
  undefined1 local_ab0 [16];
  _Alloc_hider local_aa0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a90;
  _Alloc_hider local_a80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a70;
  _Alloc_hider local_a60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a50;
  uint64_t local_a40;
  _Alloc_hider local_a38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a28;
  _Alloc_hider local_a18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a08;
  undefined1 local_9f8 [16];
  _Alloc_hider local_9e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9d8;
  _Alloc_hider local_9c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9b8;
  _Alloc_hider local_9a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_998;
  uint64_t local_988;
  _Alloc_hider local_980;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_970;
  _Alloc_hider local_960;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_950;
  RecoveredBuffer local_940 [3];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  _Alloc_hider local_878;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_868;
  _Alloc_hider local_858;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_848;
  _Alloc_hider local_838;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_828;
  uint64_t local_818;
  _Alloc_hider local_810;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_800;
  _Alloc_hider local_7f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7e0;
  undefined1 local_7d0 [16];
  _Alloc_hider local_7c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b0;
  _Alloc_hider local_7a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_790;
  _Alloc_hider local_780;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_770;
  uint64_t local_760;
  _Alloc_hider local_758;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_748;
  _Alloc_hider local_738;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_728;
  undefined1 local_718 [16];
  _Alloc_hider local_708;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f8;
  _Alloc_hider local_6e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6d8;
  _Alloc_hider local_6c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6b8;
  uint64_t local_6a8;
  _Alloc_hider local_6a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_690;
  _Alloc_hider local_680;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_670;
  undefined1 local_660 [16];
  _Alloc_hider local_650;
  char local_640 [16];
  _Alloc_hider local_630;
  char local_620 [16];
  _Alloc_hider local_610;
  char local_600 [16];
  uint64_t local_5f0;
  _Alloc_hider local_5e8;
  char local_5d8 [16];
  _Alloc_hider local_5c8;
  char local_5b8 [16];
  undefined1 local_5a8 [16];
  _Alloc_hider local_598;
  char local_588 [16];
  _Alloc_hider local_578;
  char local_568 [16];
  _Alloc_hider local_558;
  char local_548 [16];
  uint64_t local_538;
  _Alloc_hider local_530;
  char local_520 [16];
  _Alloc_hider local_510;
  char local_500 [16];
  undefined1 local_4f0 [16];
  _Alloc_hider local_4e0;
  char local_4d0 [16];
  _Alloc_hider local_4c0;
  char local_4b0 [16];
  _Alloc_hider local_4a0;
  char local_490 [16];
  uint64_t local_480;
  _Alloc_hider local_478;
  char local_468 [16];
  _Alloc_hider local_458;
  char local_448 [16];
  undefined1 local_438 [8];
  uintptr_t uStack_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  undefined1 local_418 [216];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "brecovery -- extract unconsumed binlog data from a memory dump\n\nSynopsis:\n  brecovery corefile [outputfile]\n\nArguments:\n  corefile        Path to a corefile (memory dump)\n  outputfile      Path to write recovered data. If \'-\' or unspecified, read from stdin\n\nNotes:\n  Recovery is done by looking for \'magic numbers\' in the corefile,\n  and extracting structured data following those. Metadata and unconsumed data\n  are extracted from each session, and written to the output.\n  The output is a valid binlog logfile (if it was not corrupted previously),\n  and can be read using bread:\n\n    $ brecovery app.core recovered.blog\n    $ bread recovered.blog\n\nReport bugs to:\n  https://github.com/Morgan-Stanley/binlog/issues\n"
               ,0x2cd);
    return 1;
  }
  pSVar12 = (SessionWriter *)(argv + 1);
  std::ifstream::ifstream((istream *)local_238,argv[1],_S_in|_S_bin);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar14 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)local_438);
      if (local_438 != (undefined1  [8])&local_428) {
        operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    }
    lVar17 = *in_FS_OFFSET;
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x201) {
      if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar14 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)local_438
                    );
          if (local_438 != (undefined1  [8])&local_428) {
            operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_7d0._0_8_ = 0;
        local_7d0._8_2_ = error;
        local_7c0._M_p = (pointer)&local_7b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"main","");
        local_7a0._M_p = (pointer)&local_790;
        local_11e0 = pSVar12;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a0,"main","");
        local_780._M_p = (pointer)&local_770;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_780,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                   ,"");
        local_760 = 0xfe;
        local_758._M_p = (pointer)&local_748;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_758,"Failed to open {} for reading","");
        local_11d8._0_2_ = 0x5b;
        local_940[0].type._0_2_ = 99;
        cVar7 = mserialize::cx_strcat<1ul,1ul>
                          ((cx_string<1UL> *)local_11d8,(cx_string<1UL> *)local_940);
        local_438 = (undefined1  [8])(CONCAT53(local_438._3_5_,cVar7._data) & 0xffffffffff00ffff);
        local_738._M_p = (pointer)&local_728;
        sVar9 = strlen(local_438);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_738,local_438,local_438 + sVar9);
        iVar8 = pthread_mutex_lock(ppVar1);
        if (iVar8 != 0) goto LAB_001084b8;
        local_7d0._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_7d0,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var13._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var13._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_738._M_p != &local_728) {
          operator_delete(local_738._M_p,local_728._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_758._M_p != &local_748) {
          operator_delete(local_758._M_p,local_748._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_780._M_p != &local_770) {
          operator_delete(local_780._M_p,local_770._M_allocated_capacity + 1);
        }
        pSVar12 = local_11e0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a0._M_p != &local_790) {
          operator_delete(local_7a0._M_p,local_790._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c0._M_p != &local_7b0) {
          operator_delete(local_7c0._M_p,local_7b0._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var13._M_i;
      }
      aVar3.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar14 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)local_438);
        if (local_438 != (undefined1  [8])&local_428) {
          operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      local_438 = (undefined1  [8])0x0;
      uStack_430 = 0;
      clock_gettime(0,(timespec *)local_438);
      binlog::SessionWriter::addEvent<char_const*&>
                ((SessionWriter *)(lVar17 + -0x38),
                 (uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                 (long)local_438 * 1000000000 + uStack_430,(char **)pSVar12);
    }
    anon_unknown.dwarf_1eb68::printLogs();
    iVar8 = 2;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "brecovery -- extract unconsumed binlog data from a memory dump\n\nSynopsis:\n  brecovery corefile [outputfile]\n\nArguments:\n  corefile        Path to a corefile (memory dump)\n  outputfile      Path to write recovered data. If \'-\' or unspecified, read from stdin\n\nNotes:\n  Recovery is done by looking for \'magic numbers\' in the corefile,\n  and extracting structured data following those. Metadata and unconsumed data\n  are extracted from each session, and written to the output.\n  The output is a valid binlog logfile (if it was not corrupted previously),\n  and can be read using bread:\n\n    $ brecovery app.core recovered.blog\n    $ bread recovered.blog\n\nReport bugs to:\n  https://github.com/Morgan-Stanley/binlog/issues\n"
               ,0x2cd);
    goto LAB_001079f0;
  }
  if (argc == 2) {
    pcVar18 = "-";
  }
  else {
    pcVar18 = argv[2];
  }
  std::__cxx11::string::string((string *)local_ad0,pcVar18,(allocator *)local_438);
  pRVar21 = (RecoveredBuffer *)local_438;
  std::ofstream::ofstream(pRVar21);
  iVar8 = std::__cxx11::string::compare((char *)local_ad0);
  if (iVar8 == 0) {
    pRVar21 = (RecoveredBuffer *)&std::cout;
    local_1048 = std::ostream::write;
  }
  else {
    std::ofstream::open((string *)pRVar21,(_Ios_Openmode)local_ad0);
    local_1048 = (code *)local_418;
  }
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&pRVar21->buffer)->_M_local_buf[*(long *)(*(long *)pRVar21 + -0x18) + 0x10] & 5U) == 0) {
    local_10a8.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
    super__Vector_impl_data._M_start = (RecoveredBuffer *)0x0;
    local_10a8.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
    super__Vector_impl_data._M_finish = (RecoveredBuffer *)0x0;
    local_10a8.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_db8 = -0x1deb08d91ca4244;
    local_dc0 = -0x1dec08e92cb4344;
    local_11e8 = pRVar21;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar14 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)local_11d8);
      if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
        operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    }
    local_11e0 = (SessionWriter *)(*in_FS_OFFSET + -0x38);
    pRVar21 = local_11e8;
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar14 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,
                     (string *)local_11d8);
          if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
            operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
        pRVar21 = local_11e8;
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_ab0._0_8_ = 0;
        local_ab0._8_2_ = info;
        local_aa0._M_p = (pointer)&local_a90;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_aa0,"main","");
        local_a80._M_p = (pointer)&local_a70;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a80,"main","");
        local_a60._M_p = (pointer)&local_a50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a60,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                   ,"");
        local_a40 = 0x117;
        local_a38._M_p = (pointer)&local_a28;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a38,"Read input from {}","");
        local_940[0].type._0_2_ = 0x5b;
        local_1030._0_2_ = 99;
        cVar7 = mserialize::cx_strcat<1ul,1ul>
                          ((cx_string<1UL> *)local_940,(cx_string<1UL> *)local_1030);
        local_11d8._0_8_ = CONCAT53(local_11d8._3_5_,cVar7._data) & 0xffffffffff00ffff;
        local_a18._M_p = (pointer)&local_a08;
        sVar9 = strlen(local_11d8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a18,local_11d8,local_11d8 + sVar9);
        iVar8 = pthread_mutex_lock(ppVar1);
        if (iVar8 != 0) goto LAB_001084db;
        local_ab0._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_ab0,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var13._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var13._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a18._M_p != &local_a08) {
          operator_delete(local_a18._M_p,local_a08._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a38._M_p != &local_a28) {
          operator_delete(local_a38._M_p,local_a28._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a60._M_p != &local_a50) {
          operator_delete(local_a60._M_p,local_a50._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a80._M_p != &local_a70) {
          operator_delete(local_a80._M_p,local_a70._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_aa0._M_p != &local_a90) {
          operator_delete(local_aa0._M_p,local_a90._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var13._M_i;
      }
      aVar3.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar14 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)local_11d8)
        ;
        if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
          operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        pRVar21 = local_11e8;
      }
      local_11d8._0_8_ = (pointer)0x0;
      local_11d8._8_8_ = 0;
      clock_gettime(0,(timespec *)local_11d8);
      binlog::SessionWriter::addEvent<char_const*&>
                (local_11e0,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                 local_11d8._0_8_ * 1000000000 + local_11d8._8_8_,(char **)pSVar12);
    }
    anon_unknown.dwarf_1eb68::printLogs();
    local_10c8 = &local_c70;
    local_10d8 = &local_d28;
    local_10b8 = &local_b00;
    name = local_940;
    local_1088 = local_8b8;
    local_10e0 = local_1030 + 0x88;
    local_10e8 = local_f78 + 0x88;
    local_10d0 = &local_1150;
    local_10c0 = &local_bb8;
    local_dd8 = (string *)&local_c60;
    local_de8 = (string *)&local_d18;
    local_dc8 = (string *)&local_af0;
    local_e00 = local_8a8;
    local_df0 = (string *)&local_f98;
    local_df8 = (string *)&local_ee0;
    local_de0 = (string *)&local_1140;
    local_dd0 = (string *)&local_ba8;
    local_1060 = &local_c50;
    local_1070 = &local_d08;
    local_1050 = &local_ae0;
    local_e08 = local_898;
    local_1078 = &local_f88;
    local_1080 = &local_ed0;
    local_1068 = &local_1130;
    local_1058 = &local_b98;
    while (plVar10 = (long *)std::istream::ignore((long)local_238,-1),
          *(int *)((long)plVar10 + *(long *)(*plVar10 + -0x18) + 0x20) == 0) {
      local_10b0 = 0xbc;
      uStack_10ac = 0;
      std::istream::read((char *)local_238,(long)&local_10b0 + 1);
      local_1110 = std::istream::tellg();
      if (CONCAT44(uStack_10ac,local_10b0) == local_db8) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar14 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          name = (RecoveredBuffer *)local_11d8;
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name);
          if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
            operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
        if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
          if (main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i == 0) {
            if ((char)in_FS_OFFSET[-1] == '\0') {
              pSVar14 = binlog::default_session();
              name = (RecoveredBuffer *)local_11d8;
              binlog::detail::this_thread_id_string_abi_cxx11_();
              binlog::SessionWriter::SessionWriter
                        ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name)
              ;
              if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
                operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
              }
              __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                  &__dso_handle);
              *(undefined1 *)(in_FS_OFFSET + -1) = 1;
            }
            ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
            local_b88._0_8_ = 0;
            local_b88._8_2_ = info;
            local_b78._M_p = (pointer)&local_b68;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b78,"main","");
            local_b58._M_p = (pointer)&local_b48;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b58,"main","");
            local_b38._M_p = (pointer)&local_b28;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b38,
                       "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                       ,"");
            pRVar21 = local_11e8;
            local_b18 = 0x122;
            local_b10._M_p = (pointer)local_10b8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b10,"Magic number found, read metadata at tellg={}","");
            local_11d8._0_2_ = 0x6c;
            local_af0._M_p = (pointer)local_1050;
            sVar9 = strlen(local_11d8);
            std::__cxx11::string::_M_construct<char_const*>(local_dc8,local_11d8,local_11d8 + sVar9)
            ;
            iVar8 = pthread_mutex_lock(ppVar1);
            if (iVar8 != 0) {
              iVar8 = std::__throw_system_error(iVar8);
              goto LAB_0010849c;
            }
            local_b88._0_8_ = ppVar1[3].__align;
            binlog::
            serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                      ((EventSource *)local_b88,
                       (RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
            _Var13._M_i = ppVar1[3].__align;
            ppVar1[3].__align = _Var13._M_i + 1;
            pthread_mutex_unlock(ppVar1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_af0._M_p != local_1050) {
              operator_delete(local_af0._M_p,local_ae0._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b10._M_p != local_10b8) {
              operator_delete(local_b10._M_p,local_b00._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b38._M_p != &local_b28) {
              operator_delete(local_b38._M_p,local_b28._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b58._M_p != &local_b48) {
              operator_delete(local_b58._M_p,local_b48._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b78._M_p != &local_b68) {
              operator_delete(local_b78._M_p,local_b68._M_allocated_capacity + 1);
            }
            LOCK();
            UNLOCK();
            main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var13._M_i;
          }
          aVar3.super___atomic_base<unsigned_long>._M_i =
               main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i;
          if ((char)in_FS_OFFSET[-1] == '\0') {
            pSVar14 = binlog::default_session();
            name = (RecoveredBuffer *)local_11d8;
            binlog::detail::this_thread_id_string_abi_cxx11_();
            binlog::SessionWriter::SessionWriter
                      ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name);
            if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
              operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
            }
            __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                &__dso_handle);
            *(undefined1 *)(in_FS_OFFSET + -1) = 1;
          }
          local_11d8._0_8_ = (pointer)0x0;
          local_11d8._8_8_ = 0;
          clock_gettime(0,(timespec *)local_11d8);
          binlog::SessionWriter::addEvent<long_const&>
                    (local_11e0,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                     local_11d8._0_8_ * 1000000000 + local_11d8._8_8_,&local_1110);
        }
        anon_unknown.dwarf_1eb68::printLogs();
        local_1040._8_8_ = 0;
        std::istream::read((char *)local_238,(long)(local_1040 + 8));
        local_1040._0_8_ = local_1040._8_8_;
        local_1120 = 0;
        std::istream::read((char *)local_238,(long)&local_1120);
        uVar4 = local_1120;
        sVar11 = anon_unknown.dwarf_1eb68::remainingSize((istream *)local_238);
        if (sVar11 < uVar4) {
          if ((char)in_FS_OFFSET[-1] == '\0') {
            pSVar14 = binlog::default_session();
            binlog::detail::this_thread_id_string_abi_cxx11_();
            name = (RecoveredBuffer *)local_1218;
            binlog::SessionWriter::SessionWriter
                      ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name);
            if ((undefined1 *)local_1218._0_8_ != local_1218 + 0x10) {
              operator_delete((void *)local_1218._0_8_,(ulong)(local_1218._16_8_ + 1));
            }
            __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                &__dso_handle);
            *(undefined1 *)(in_FS_OFFSET + -1) = 1;
          }
          if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x201) {
            if (_ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_0
                == 0) {
              if ((char)in_FS_OFFSET[-1] == '\0') {
                pSVar14 = binlog::default_session();
                binlog::detail::this_thread_id_string_abi_cxx11_();
                name = (RecoveredBuffer *)local_1218;
                binlog::SessionWriter::SessionWriter
                          ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,
                           (string *)name);
                if ((undefined1 *)local_1218._0_8_ != local_1218 + 0x10) {
                  operator_delete((void *)local_1218._0_8_,(ulong)(local_1218._16_8_ + 1));
                }
                __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                    &__dso_handle);
                *(undefined1 *)(in_FS_OFFSET + -1) = 1;
                pRVar21 = local_11e8;
              }
              ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
              local_11d8._0_8_ = (pointer)0x0;
              local_11d8._8_2_ = 0x200;
              local_11d8._16_8_ = &local_11b8;
              local_11b8._M_allocated_capacity._0_4_ = 0x6e69616d;
              local_11d8._24_8_ = (pointer)0x4;
              local_11b8._M_allocated_capacity._4_4_ =
                   local_11b8._M_allocated_capacity._4_4_ & 0xffffff00;
              local_11a8._M_p = (pointer)&local_1198;
              local_1198._M_allocated_capacity = 0x6174654d64616572;
              local_1198._8_4_ = 0x61746164;
              local_11a0 = 0xc;
              local_1198._M_local_buf[0xc] = '\0';
              local_1188._M_p = (pointer)&local_1178;
              local_1218._0_8_ = (pointer)0x5a;
              local_1188._M_p =
                   (pointer)std::__cxx11::string::_M_create((ulong *)&local_1188,(ulong)local_1218);
              uVar15 = local_1218._0_8_;
              local_1178._M_allocated_capacity = local_1218._0_8_;
              memcpy(local_1188._M_p,
                     "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                     ,0x5a);
              local_1180 = (pointer)uVar15;
              local_1188._M_p[uVar15] = '\0';
              local_1168 = 0x82;
              local_1160._M_p = (pointer)local_10d0;
              local_1218._0_8_ = (pointer)0x1d;
              local_1160._M_p =
                   (pointer)std::__cxx11::string::_M_create((ulong *)&local_1160,(ulong)local_1218);
              local_1150._M_allocated_capacity = local_1218._0_8_;
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0xd) = '\'';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0xe) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0xf) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0x10) = 'h';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0x11) = 'a';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0x12) = 'v';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0x13) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0x14) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0x15) = '{';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0x16) = '}';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0x17) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0x18) = 'b';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0x19) = 'y';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0x1a) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0x1b) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0x1c) = 's';
              *(undefined8 *)local_1160._M_p = 0x207475706e492020;
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 8) = 'd';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 9) = 'o';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 10) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0xb) = 's';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0xc) = 'n';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0xd) = '\'';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0xe) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1160._M_p + 0xf) = ' ';
              local_1158 = (pointer)local_1218._0_8_;
              local_1160._M_p[local_1218._0_8_] = '\0';
              local_1218._0_2_ = 0x4c;
              local_1140._M_p = (pointer)local_1068;
              sVar9 = strlen(local_1218);
              std::__cxx11::string::_M_construct<char_const*>
                        (local_de0,local_1218,local_1218 + sVar9);
              iVar8 = pthread_mutex_lock(ppVar1);
              if (iVar8 != 0) goto LAB_001084b1;
              local_11d8._0_8_ = ppVar1[3].__align;
              binlog::
              serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                        ((EventSource *)local_11d8,
                         (RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
              uVar2 = ppVar1[3].__align;
              ppVar1[3].__align = uVar2 + 1;
              pthread_mutex_unlock(ppVar1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1140._M_p != local_1068) {
                operator_delete(local_1140._M_p,local_1130._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1160._M_p != local_10d0) {
                operator_delete(local_1160._M_p,local_1150._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1188._M_p != &local_1178) {
                operator_delete(local_1188._M_p,local_1178._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_11a8._M_p != &local_1198) {
                operator_delete(local_11a8._M_p,local_1198._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_11d8._16_8_ != &local_11b8) {
                operator_delete((void *)local_11d8._16_8_,
                                CONCAT44(local_11b8._M_allocated_capacity._4_4_,
                                         local_11b8._M_allocated_capacity._0_4_) + 1);
              }
              LOCK();
              UNLOCK();
              _ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_0
                   = uVar2;
            }
            uVar2 = 
            _ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_0
            ;
            if ((char)in_FS_OFFSET[-1] == '\0') {
              pSVar14 = binlog::default_session();
              binlog::detail::this_thread_id_string_abi_cxx11_();
              name = (RecoveredBuffer *)local_1218;
              binlog::SessionWriter::SessionWriter
                        ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name)
              ;
              if ((undefined1 *)local_1218._0_8_ != local_1218 + 0x10) {
                operator_delete((void *)local_1218._0_8_,(ulong)(local_1218._16_8_ + 1));
              }
              __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                  &__dso_handle);
              *(undefined1 *)(in_FS_OFFSET + -1) = 1;
            }
            local_1218._0_8_ = (pointer)0x0;
            local_1218._8_8_ = 0;
            clock_gettime(0,(timespec *)local_1218);
            binlog::SessionWriter::addEvent<unsigned_long&>
                      (local_11e0,uVar2,local_1218._0_8_ * 1000000000 + local_1218._8_8_,&local_1120
                      );
          }
          anon_unknown.dwarf_1eb68::printLogs();
          goto LAB_00105a97;
        }
        local_1108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_1108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_1108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<char,_std::allocator<char>_>::resize(&local_1108,local_1120);
        std::istream::read((char *)local_238,
                           (long)local_1108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start);
        if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
          if ((char)in_FS_OFFSET[-1] == '\0') {
            pSVar14 = binlog::default_session();
            binlog::detail::this_thread_id_string_abi_cxx11_();
            name = (RecoveredBuffer *)local_1218;
            binlog::SessionWriter::SessionWriter
                      ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name);
            if ((undefined1 *)local_1218._0_8_ != local_1218 + 0x10) {
              operator_delete((void *)local_1218._0_8_,(ulong)(local_1218._16_8_ + 1));
            }
            __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                &__dso_handle);
            *(undefined1 *)(in_FS_OFFSET + -1) = 1;
          }
          if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x201) {
            if (_ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_1_0
                == 0) {
              if ((char)in_FS_OFFSET[-1] == '\0') {
                pSVar14 = binlog::default_session();
                name = (RecoveredBuffer *)local_1218;
                binlog::detail::this_thread_id_string_abi_cxx11_();
                binlog::SessionWriter::SessionWriter
                          ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,
                           (string *)name);
                if ((undefined1 *)local_1218._0_8_ != local_1218 + 0x10) {
                  operator_delete((void *)local_1218._0_8_,(ulong)(local_1218._16_8_ + 1));
                }
                __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                    &__dso_handle);
                *(undefined1 *)(in_FS_OFFSET + -1) = 1;
                pRVar21 = local_11e8;
              }
              ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
              local_1030._0_8_ = (pointer)0x0;
              local_1030._8_2_ = error;
              local_1030._16_8_ = local_1030 + 0x20;
              local_1030._32_4_ = 0x6e69616d;
              local_1030._24_8_ = 4;
              local_1030._36_4_ = local_1030._36_4_ & 0xffffff00;
              local_1030._48_8_ = local_1030 + 0x40;
              local_1030._64_8_ = 0x6174654d64616572;
              local_1030._72_4_ = 0x61746164;
              local_1030._56_8_ = 0xc;
              local_1030[0x4c] = '\0';
              local_1030._80_8_ = local_1030 + 0x60;
              local_1218._0_8_ = (pointer)0x5a;
              local_1030._80_8_ =
                   std::__cxx11::string::_M_create((ulong *)(local_1030 + 0x50),(ulong)local_1218);
              uVar15 = local_1218._0_8_;
              local_1030._96_8_ = local_1218._0_8_;
              memcpy((void *)local_1030._80_8_,
                     "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                     ,0x5a);
              local_1030._88_8_ = uVar15;
              *(char *)(local_1030._80_8_ + uVar15) = '\0';
              local_1030._112_8_ = 0x94;
              local_1030._120_8_ = local_10e0;
              local_1218._0_8_ = (pointer)0x30;
              local_1030._120_8_ =
                   std::__cxx11::string::_M_create((ulong *)(local_1030 + 0x78),(ulong)local_1218);
              local_1030._136_8_ = local_1218._0_8_;
              builtin_strncpy((char *)local_1030._120_8_,
                              "  Failed to read {} bytes of metadata from input",0x30);
              local_1030._128_8_ = local_1218._0_8_;
              *(char *)(local_1030._120_8_ + local_1218._0_8_) = '\0';
              local_1218._0_2_ = 0x4c;
              local_f98._M_p = (pointer)local_1078;
              sVar9 = strlen(local_1218);
              std::__cxx11::string::_M_construct<char_const*>
                        (local_df0,local_1218,local_1218 + sVar9);
              iVar8 = pthread_mutex_lock(ppVar1);
              if (iVar8 != 0) goto LAB_001084bf;
              local_1030._0_8_ = ppVar1[3].__align;
              binlog::
              serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                        ((EventSource *)local_1030,
                         (RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
              uVar2 = ppVar1[3].__align;
              ppVar1[3].__align = uVar2 + 1;
              pthread_mutex_unlock(ppVar1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f98._M_p != local_1078) {
                operator_delete(local_f98._M_p,local_f88._M_allocated_capacity + 1);
              }
              if ((char *)local_1030._120_8_ != local_10e0) {
                operator_delete((void *)local_1030._120_8_,local_1030._136_8_ + 1);
              }
              if ((undefined1 *)local_1030._80_8_ != local_1030 + 0x60) {
                operator_delete((void *)local_1030._80_8_,local_1030._96_8_ + 1);
              }
              if ((undefined1 *)local_1030._48_8_ != local_1030 + 0x40) {
                operator_delete((void *)local_1030._48_8_,local_1030._64_8_ + 1);
              }
              if ((undefined1 *)local_1030._16_8_ != local_1030 + 0x20) {
                operator_delete((void *)local_1030._16_8_,
                                CONCAT44(local_1030._36_4_,local_1030._32_4_) + 1);
              }
              LOCK();
              UNLOCK();
              _ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_1_0
                   = uVar2;
            }
            uVar2 = 
            _ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_1_0
            ;
            if ((char)in_FS_OFFSET[-1] == '\0') {
              pSVar14 = binlog::default_session();
              name = (RecoveredBuffer *)local_1218;
              binlog::detail::this_thread_id_string_abi_cxx11_();
              binlog::SessionWriter::SessionWriter
                        ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name)
              ;
              if ((undefined1 *)local_1218._0_8_ != local_1218 + 0x10) {
                operator_delete((void *)local_1218._0_8_,(ulong)(local_1218._16_8_ + 1));
              }
              __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                  &__dso_handle);
              *(undefined1 *)(in_FS_OFFSET + -1) = 1;
            }
            local_1218._0_8_ = (pointer)0x0;
            local_1218._8_8_ = 0;
            clock_gettime(0,(timespec *)local_1218);
            binlog::SessionWriter::addEvent<unsigned_long&>
                      (local_11e0,uVar2,local_1218._0_8_ * 1000000000 + local_1218._8_8_,&local_1120
                      );
          }
          anon_unknown.dwarf_1eb68::printLogs();
LAB_00105a70:
          bVar6 = false;
          goto LAB_00105a72;
        }
        bVar6 = anon_unknown.dwarf_1eb68::checkEntryBuffer
                          ((anon_unknown_dwarf_1eb68 *)
                           local_1108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (vector<char,_std::allocator<char>_> *)
                           local_1108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish);
        if (!bVar6) goto LAB_00105a70;
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar14 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          name = (RecoveredBuffer *)local_1218;
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name);
          if ((undefined1 *)local_1218._0_8_ != local_1218 + 0x10) {
            operator_delete((void *)local_1218._0_8_,(ulong)(local_1218._16_8_ + 1));
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
          pRVar21 = local_11e8;
        }
        if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
          if (_ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_2_0
              == 0) {
            if ((char)in_FS_OFFSET[-1] == '\0') {
              pSVar14 = binlog::default_session();
              binlog::detail::this_thread_id_string_abi_cxx11_();
              binlog::SessionWriter::SessionWriter
                        ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,
                         (string *)local_1218);
              if ((undefined1 *)local_1218._0_8_ != local_1218 + 0x10) {
                operator_delete((void *)local_1218._0_8_,(ulong)(local_1218._16_8_ + 1));
              }
              __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                  &__dso_handle);
              *(undefined1 *)(in_FS_OFFSET + -1) = 1;
              pRVar21 = local_11e8;
            }
            ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
            local_f78._0_8_ = 0;
            local_f78._8_2_ = info;
            local_f78._16_8_ = local_f78 + 0x20;
            local_f78._32_4_ = 0x6e69616d;
            local_f78._24_8_ = 4;
            local_f78._36_4_ = local_f78._36_4_ & 0xffffff00;
            local_f78._48_8_ = local_f78 + 0x40;
            local_f78._64_8_ = 0x6174654d64616572;
            local_f78._72_4_ = 0x61746164;
            local_f78._56_8_ = 0xc;
            local_f78[0x4c] = '\0';
            local_f78._80_8_ = local_f78 + 0x60;
            local_1218._0_8_ = (pointer)0x5a;
            local_f78._80_8_ =
                 std::__cxx11::string::_M_create((ulong *)(local_f78 + 0x50),(ulong)local_1218);
            uVar15 = local_1218._0_8_;
            local_f78._96_8_ = local_1218._0_8_;
            memcpy((void *)local_f78._80_8_,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                   ,0x5a);
            local_f78._88_8_ = uVar15;
            *(char *)(local_f78._80_8_ + uVar15) = '\0';
            local_f78._112_8_ = 0x9a;
            local_f78._120_8_ = local_10e8;
            local_1218._0_8_ = (pointer)0x30;
            local_f78._120_8_ =
                 std::__cxx11::string::_M_create((ulong *)(local_f78 + 0x78),(ulong)local_1218);
            local_f78._136_8_ = local_1218._0_8_;
            builtin_strncpy((char *)local_f78._120_8_,
                            "  Recovered {} bytes of metadata from session={}",0x30);
            local_f78._128_8_ = local_1218._0_8_;
            *(char *)(local_f78._120_8_ + local_1218._0_8_) = '\0';
            local_1112._data[0] = 'L';
            local_1112._data[1] = '\0';
            local_1114._data[0] = 'L';
            local_1114._data[1] = '\0';
            cVar7 = mserialize::cx_strcat<1ul,1ul>(&local_1112,&local_1114);
            local_1218[0] = cVar7._data[0];
            local_1218[1] = cVar7._data[1];
            local_1218[2] = cVar7._data[2];
            local_ee0._M_p = (pointer)local_1080;
            sVar9 = strlen(local_1218);
            std::__cxx11::string::_M_construct<char_const*>(local_df8,local_1218,local_1218 + sVar9)
            ;
            iVar8 = pthread_mutex_lock(ppVar1);
            if (iVar8 != 0) goto LAB_001084d4;
            local_f78._0_8_ = ppVar1[3].__align;
            binlog::
            serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                      ((EventSource *)local_f78,
                       (RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
            uVar2 = ppVar1[3].__align;
            ppVar1[3].__align = uVar2 + 1;
            pthread_mutex_unlock(ppVar1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ee0._M_p != local_1080) {
              operator_delete(local_ee0._M_p,local_ed0._M_allocated_capacity + 1);
            }
            if ((char *)local_f78._120_8_ != local_10e8) {
              operator_delete((void *)local_f78._120_8_,local_f78._136_8_ + 1);
            }
            if ((undefined1 *)local_f78._80_8_ != local_f78 + 0x60) {
              operator_delete((void *)local_f78._80_8_,local_f78._96_8_ + 1);
            }
            if ((undefined1 *)local_f78._48_8_ != local_f78 + 0x40) {
              operator_delete((void *)local_f78._48_8_,local_f78._64_8_ + 1);
            }
            if ((undefined1 *)local_f78._16_8_ != local_f78 + 0x20) {
              operator_delete((void *)local_f78._16_8_,
                              CONCAT44(local_f78._36_4_,local_f78._32_4_) + 1);
            }
            LOCK();
            UNLOCK();
            _ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_2_0
                 = uVar2;
          }
          uVar2 = 
          _ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_2_0
          ;
          if ((char)in_FS_OFFSET[-1] == '\0') {
            pSVar14 = binlog::default_session();
            binlog::detail::this_thread_id_string_abi_cxx11_();
            binlog::SessionWriter::SessionWriter
                      ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,
                       (string *)local_1218);
            if ((undefined1 *)local_1218._0_8_ != local_1218 + 0x10) {
              operator_delete((void *)local_1218._0_8_,(ulong)(local_1218._16_8_ + 1));
            }
            __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                &__dso_handle);
            *(undefined1 *)(in_FS_OFFSET + -1) = 1;
            pRVar21 = local_11e8;
          }
          local_1218._0_8_ = (pointer)0x0;
          local_1218._8_8_ = 0;
          clock_gettime(0,(timespec *)local_1218);
          lVar17 = local_1218._0_8_ * 1000000000;
          local_1218._0_8_ =
               (long)local_1108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_1108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
          name = (RecoveredBuffer *)local_1040;
          binlog::SessionWriter::addEvent<unsigned_long,unsigned_long_const&>
                    (local_11e0,uVar2,lVar17 + local_1218._8_8_,(unsigned_long *)local_1218,
                     (unsigned_long *)name);
        }
        anon_unknown.dwarf_1eb68::printLogs();
        local_1218._0_8_ = local_1218._0_8_ & 0xffffffff00000000;
        local_1218._8_8_ = local_1040._0_8_;
        local_1218._16_8_ =
             local_1108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_1218._24_8_ =
             local_1108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_11f8 = local_1108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        local_1108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_1108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_1108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>::
        emplace_back<RecoveredBuffer>(&local_10a8,(RecoveredBuffer *)local_1218);
        if ((anon_unknown_dwarf_1eb68 *)local_1218._16_8_ != (anon_unknown_dwarf_1eb68 *)0x0) {
          operator_delete((void *)local_1218._16_8_,(long)local_11f8 - local_1218._16_8_);
        }
        bVar6 = true;
LAB_00105a72:
        if ((anon_unknown_dwarf_1eb68 *)
            local_1108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (anon_unknown_dwarf_1eb68 *)0x0) {
          operator_delete(local_1108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (!bVar6) {
LAB_00105a97:
          if ((char)in_FS_OFFSET[-1] == '\0') {
            pSVar14 = binlog::default_session();
            binlog::detail::this_thread_id_string_abi_cxx11_();
            name = (RecoveredBuffer *)local_11d8;
            binlog::SessionWriter::SessionWriter
                      ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name);
            if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
              operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
            }
            __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                &__dso_handle);
            *(undefined1 *)(in_FS_OFFSET + -1) = 1;
          }
          if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x201) {
            if (main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i == 0) {
              if ((char)in_FS_OFFSET[-1] == '\0') {
                pSVar14 = binlog::default_session();
                name = (RecoveredBuffer *)local_11d8;
                binlog::detail::this_thread_id_string_abi_cxx11_();
                binlog::SessionWriter::SessionWriter
                          ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,
                           (string *)name);
                if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
                  operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
                }
                __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                    &__dso_handle);
                *(undefined1 *)(in_FS_OFFSET + -1) = 1;
              }
              ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
              local_c40._0_8_ = 0;
              local_c40._8_2_ = error;
              local_c30._M_p = (pointer)&local_c20;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_c30,"main","");
              local_c10._M_p = (pointer)&local_c00;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_c10,"main","");
              local_bf0._M_p = (pointer)&local_be0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_bf0,
                         "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                         ,"");
              pRVar21 = local_11e8;
              local_bd0 = 0x125;
              local_bc8._M_p = (pointer)local_10c0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_bc8,
                         "  Failed to read metadata, continue searching at tellg={}","");
              local_11d8._0_2_ = 0x6c;
              local_ba8._M_p = (pointer)local_1058;
              sVar9 = strlen(local_11d8);
              std::__cxx11::string::_M_construct<char_const*>
                        (local_dd0,local_11d8,local_11d8 + sVar9);
              iVar8 = pthread_mutex_lock(ppVar1);
              if (iVar8 != 0) goto LAB_001084a3;
              local_c40._0_8_ = ppVar1[3].__align;
              binlog::
              serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                        ((EventSource *)local_c40,
                         (RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
              _Var13._M_i = ppVar1[3].__align;
              ppVar1[3].__align = _Var13._M_i + 1;
              pthread_mutex_unlock(ppVar1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_ba8._M_p != local_1058) {
                operator_delete(local_ba8._M_p,local_b98._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_bc8._M_p != local_10c0) {
                operator_delete(local_bc8._M_p,local_bb8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_bf0._M_p != &local_be0) {
                operator_delete(local_bf0._M_p,local_be0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c10._M_p != &local_c00) {
                operator_delete(local_c10._M_p,local_c00._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c30._M_p != &local_c20) {
                operator_delete(local_c30._M_p,local_c20._M_allocated_capacity + 1);
              }
              LOCK();
              UNLOCK();
              main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var13._M_i;
            }
            aVar3.super___atomic_base<unsigned_long>._M_i =
                 main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i;
            if ((char)in_FS_OFFSET[-1] == '\0') {
              pSVar14 = binlog::default_session();
              name = (RecoveredBuffer *)local_11d8;
              binlog::detail::this_thread_id_string_abi_cxx11_();
              binlog::SessionWriter::SessionWriter
                        ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name)
              ;
              if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
                operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
              }
              __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                  &__dso_handle);
              *(undefined1 *)(in_FS_OFFSET + -1) = 1;
            }
            local_11d8._0_8_ = (pointer)0x0;
            local_11d8._8_8_ = 0;
            clock_gettime(0,(timespec *)local_11d8);
            binlog::SessionWriter::addEvent<long_const&>
                      (local_11e0,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                       local_11d8._0_8_ * 1000000000 + local_11d8._8_8_,&local_1110);
          }
          anon_unknown.dwarf_1eb68::printLogs();
LAB_00105d42:
          std::ios::clear((int)*(undefined8 *)(local_238[0] + -0x18) + (int)(istream *)local_238);
          std::istream::seekg((istream *)local_238,local_1110,0);
        }
      }
      else if (CONCAT44(uStack_10ac,local_10b0) == local_dc0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar14 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          name = (RecoveredBuffer *)local_11d8;
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name);
          if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
            operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
        if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
          if (main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i == 0) {
            if ((char)in_FS_OFFSET[-1] == '\0') {
              pSVar14 = binlog::default_session();
              name = (RecoveredBuffer *)local_11d8;
              binlog::detail::this_thread_id_string_abi_cxx11_();
              binlog::SessionWriter::SessionWriter
                        ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name)
              ;
              if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
                operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
              }
              __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                  &__dso_handle);
              *(undefined1 *)(in_FS_OFFSET + -1) = 1;
            }
            ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
            local_cf8._0_8_ = 0;
            local_cf8._8_2_ = info;
            local_ce8._M_p = (pointer)&local_cd8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_ce8,"main","");
            local_cc8._M_p = (pointer)&local_cb8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_cc8,"main","");
            local_ca8._M_p = (pointer)&local_c98;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_ca8,
                       "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                       ,"");
            pRVar21 = local_11e8;
            local_c88 = 300;
            local_c80._M_p = (pointer)local_10c8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c80,"Magic number found, read data at tellg={}","");
            local_11d8._0_2_ = 0x6c;
            local_c60._M_p = (pointer)local_1060;
            sVar9 = strlen(local_11d8);
            std::__cxx11::string::_M_construct<char_const*>(local_dd8,local_11d8,local_11d8 + sVar9)
            ;
            iVar8 = pthread_mutex_lock(ppVar1);
            if (iVar8 != 0) goto LAB_001084aa;
            local_cf8._0_8_ = ppVar1[3].__align;
            binlog::
            serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                      ((EventSource *)local_cf8,
                       (RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
            _Var13._M_i = ppVar1[3].__align;
            ppVar1[3].__align = _Var13._M_i + 1;
            pthread_mutex_unlock(ppVar1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c60._M_p != local_1060) {
              operator_delete(local_c60._M_p,local_c50._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c80._M_p != local_10c8) {
              operator_delete(local_c80._M_p,local_c70._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ca8._M_p != &local_c98) {
              operator_delete(local_ca8._M_p,local_c98._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_cc8._M_p != &local_cb8) {
              operator_delete(local_cc8._M_p,local_cb8._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ce8._M_p != &local_cd8) {
              operator_delete(local_ce8._M_p,local_cd8._M_allocated_capacity + 1);
            }
            LOCK();
            UNLOCK();
            main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var13._M_i;
          }
          aVar3.super___atomic_base<unsigned_long>._M_i =
               main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i;
          if ((char)in_FS_OFFSET[-1] == '\0') {
            pSVar14 = binlog::default_session();
            name = (RecoveredBuffer *)local_11d8;
            binlog::detail::this_thread_id_string_abi_cxx11_();
            binlog::SessionWriter::SessionWriter
                      ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name);
            if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
              operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
            }
            __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                &__dso_handle);
            *(undefined1 *)(in_FS_OFFSET + -1) = 1;
          }
          local_11d8._0_8_ = (pointer)0x0;
          local_11d8._8_8_ = 0;
          clock_gettime(0,(timespec *)local_11d8);
          binlog::SessionWriter::addEvent<long_const&>
                    (local_11e0,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                     local_11d8._0_8_ * 1000000000 + local_11d8._8_8_,&local_1110);
        }
        anon_unknown.dwarf_1eb68::printLogs();
        bVar6 = anon_unknown.dwarf_1eb68::readData((istream *)local_238,&local_10a8);
        if (!bVar6) {
          if ((char)in_FS_OFFSET[-1] == '\0') {
            pSVar14 = binlog::default_session();
            binlog::detail::this_thread_id_string_abi_cxx11_();
            name = (RecoveredBuffer *)local_11d8;
            binlog::SessionWriter::SessionWriter
                      ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name);
            if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
              operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
            }
            __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                &__dso_handle);
            *(undefined1 *)(in_FS_OFFSET + -1) = 1;
          }
          if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x201) {
            if (main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i == 0) {
              if ((char)in_FS_OFFSET[-1] == '\0') {
                pSVar14 = binlog::default_session();
                name = (RecoveredBuffer *)local_11d8;
                binlog::detail::this_thread_id_string_abi_cxx11_();
                binlog::SessionWriter::SessionWriter
                          ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,
                           (string *)name);
                if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
                  operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
                }
                __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                    &__dso_handle);
                *(undefined1 *)(in_FS_OFFSET + -1) = 1;
              }
              ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
              local_db0._0_8_ = 0;
              local_db0._8_2_ = error;
              local_da0._M_p = (pointer)&local_d90;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_da0,"main","");
              local_d80._M_p = (pointer)&local_d70;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_d80,"main","");
              local_d60._M_p = (pointer)&local_d50;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d60,
                         "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                         ,"");
              pRVar21 = local_11e8;
              local_d40 = 0x12f;
              local_d38._M_p = (pointer)local_10d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d38,
                         "  Failed to read data, continue searching at tellg={}","");
              local_11d8._0_2_ = 0x6c;
              local_d18._M_p = (pointer)local_1070;
              sVar9 = strlen(local_11d8);
              std::__cxx11::string::_M_construct<char_const*>
                        (local_de8,local_11d8,local_11d8 + sVar9);
              iVar8 = pthread_mutex_lock(ppVar1);
              if (iVar8 != 0) goto LAB_001084c6;
              local_db0._0_8_ = ppVar1[3].__align;
              binlog::
              serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                        ((EventSource *)local_db0,
                         (RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
              _Var13._M_i = ppVar1[3].__align;
              ppVar1[3].__align = _Var13._M_i + 1;
              pthread_mutex_unlock(ppVar1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d18._M_p != local_1070) {
                operator_delete(local_d18._M_p,local_d08._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d38._M_p != local_10d8) {
                operator_delete(local_d38._M_p,local_d28._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d60._M_p != &local_d50) {
                operator_delete(local_d60._M_p,local_d50._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d80._M_p != &local_d70) {
                operator_delete(local_d80._M_p,local_d70._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_da0._M_p != &local_d90) {
                operator_delete(local_da0._M_p,local_d90._M_allocated_capacity + 1);
              }
              LOCK();
              UNLOCK();
              main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var13._M_i;
            }
            aVar3.super___atomic_base<unsigned_long>._M_i =
                 main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i;
            if ((char)in_FS_OFFSET[-1] == '\0') {
              pSVar14 = binlog::default_session();
              name = (RecoveredBuffer *)local_11d8;
              binlog::detail::this_thread_id_string_abi_cxx11_();
              binlog::SessionWriter::SessionWriter
                        ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name)
              ;
              if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
                operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
              }
              __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                  &__dso_handle);
              *(undefined1 *)(in_FS_OFFSET + -1) = 1;
            }
            local_11d8._0_8_ = (pointer)0x0;
            local_11d8._8_8_ = 0;
            clock_gettime(0,(timespec *)local_11d8);
            binlog::SessionWriter::addEvent<long_const&>
                      (local_11e0,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                       local_11d8._0_8_ * 1000000000 + local_11d8._8_8_,&local_1110);
          }
          anon_unknown.dwarf_1eb68::printLogs();
          goto LAB_00105d42;
        }
      }
      else {
        std::istream::seekg((long)local_238,0xfffffff9);
      }
    }
    if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar14 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        name = (RecoveredBuffer *)local_11d8;
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name);
        if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
          operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        pRVar21 = local_11e8;
      }
      if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x201) {
        if (main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i == 0) {
          pSVar12 = binlog::default_thread_local_writer();
          pSVar14 = pSVar12->_session;
          local_660._0_8_ = 0;
          local_660._8_2_ = error;
          local_650._M_p = local_640;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"main","");
          local_630._M_p = local_620;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"main","");
          local_610._M_p = local_600;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_610,
                     "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                     ,"");
          local_5f0 = 0x141;
          local_5e8._M_p = local_5d8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_5e8,"Failure while reading input, continue anyway","");
          local_11d8._0_8_ = local_11d8._0_8_ & 0xffffffffffffff00;
          local_5c8._M_p = local_5b8;
          sVar9 = strlen(local_11d8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_5c8,local_11d8,local_11d8 + sVar9);
          _Var13._M_i = binlog::Session::addEventSource(pSVar14,(EventSource *)local_660);
          binlog::EventSource::~EventSource((EventSource *)local_660);
          LOCK();
          UNLOCK();
          main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var13._M_i;
        }
        _Var13 = main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i;
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar14 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          name = (RecoveredBuffer *)local_11d8;
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name);
LAB_0010822e:
          if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
            operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
          pRVar21 = local_11e8;
        }
LAB_00106d5d:
        local_11d8._0_8_ = (pointer)0x0;
        local_11d8._8_8_ = 0;
        clock_gettime(0,(timespec *)local_11d8);
        binlog::SessionWriter::addEvent<>
                  (local_11e0,_Var13._M_i,local_11d8._0_8_ * 1000000000 + local_11d8._8_8_);
      }
    }
    else {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar14 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        name = (RecoveredBuffer *)local_11d8;
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name);
        if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
          operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        pRVar21 = local_11e8;
      }
      if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
        if (main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i == 0) {
          pSVar12 = binlog::default_thread_local_writer();
          pSVar14 = pSVar12->_session;
          local_5a8._0_8_ = 0;
          local_5a8._8_2_ = info;
          local_598._M_p = local_588;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"main","");
          local_578._M_p = local_568;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"main","");
          local_558._M_p = local_548;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_558,
                     "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                     ,"");
          local_538 = 0x13d;
          local_530._M_p = local_520;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_530,"Done reading input","");
          local_11d8._0_8_ = local_11d8._0_8_ & 0xffffffffffffff00;
          local_510._M_p = local_500;
          sVar9 = strlen(local_11d8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_510,local_11d8,local_11d8 + sVar9);
          _Var13._M_i = binlog::Session::addEventSource(pSVar14,(EventSource *)local_5a8);
          binlog::EventSource::~EventSource((EventSource *)local_5a8);
          LOCK();
          UNLOCK();
          main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var13._M_i;
        }
        _Var13 = main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i;
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar14 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          name = (RecoveredBuffer *)local_11d8;
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name);
          goto LAB_0010822e;
        }
        goto LAB_00106d5d;
      }
    }
    anon_unknown.dwarf_1eb68::printLogs();
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar14 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      name = (RecoveredBuffer *)local_11d8;
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name);
      if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
        operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      pRVar21 = local_11e8;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar14 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          name = (RecoveredBuffer *)local_11d8;
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name);
          if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
            operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
          pRVar21 = local_11e8;
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_888._0_8_ = 0;
        local_888._8_2_ = info;
        local_878._M_p = (pointer)&local_868;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_878,"main","");
        local_858._M_p = (pointer)&local_848;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"main","");
        local_838._M_p = (pointer)&local_828;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_838,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                   ,"");
        local_818 = 0x144;
        local_810._M_p = (pointer)&local_800;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"Write output","");
        local_11d8._0_8_ = local_11d8._0_8_ & 0xffffffffffffff00;
        local_7f0._M_p = (pointer)&local_7e0;
        sVar9 = strlen(local_11d8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_7f0,local_11d8,local_11d8 + sVar9);
        iVar8 = pthread_mutex_lock(ppVar1);
        if (iVar8 != 0) {
LAB_001084e2:
          iVar8 = std::__throw_system_error(iVar8);
LAB_001084e9:
          uVar15 = std::__throw_system_error(iVar8);
          if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
            operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
          }
          std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>::~vector(&local_10a8);
          std::ofstream::~ofstream(local_438);
          if (local_ad0[0] != local_ac0) {
            operator_delete(local_ad0[0],local_ac0[0] + 1);
          }
          std::ifstream::~ifstream(local_238);
          _Unwind_Resume(uVar15);
        }
        local_888._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_888,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var13._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var13._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7f0._M_p != &local_7e0) {
          operator_delete(local_7f0._M_p,local_7e0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_810._M_p != &local_800) {
          operator_delete(local_810._M_p,local_800._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_838._M_p != &local_828) {
          operator_delete(local_838._M_p,local_828._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_858._M_p != &local_848) {
          operator_delete(local_858._M_p,local_848._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_878._M_p != &local_868) {
          operator_delete(local_878._M_p,local_868._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var13._M_i;
      }
      aVar3.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar14 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        name = (RecoveredBuffer *)local_11d8;
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)name);
        if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
          operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        pRVar21 = local_11e8;
      }
      local_11d8._0_8_ = (pointer)0x0;
      local_11d8._8_8_ = 0;
      clock_gettime(0,(timespec *)local_11d8);
      binlog::SessionWriter::addEvent<>
                (local_11e0,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                 local_11d8._0_8_ * 1000000000 + local_11d8._8_8_);
    }
    anon_unknown.dwarf_1eb68::printLogs();
    pRVar5 = local_10a8.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pRVar22 = local_10a8.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (local_10a8.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_10a8.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar19 = (long)local_10a8.
                     super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_10a8.
                     super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar16 = (lVar19 >> 3) * -0x3333333333333333;
      lVar17 = 0x3f;
      if (uVar16 != 0) {
        for (; uVar16 >> lVar17 == 0; lVar17 = lVar17 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<RecoveredBuffer*,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                (local_10a8.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_10a8.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>.
                 _M_impl.super__Vector_impl_data._M_finish,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar19 < 0x281) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<RecoveredBuffer*,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                  (pRVar22,pRVar5);
      }
      else {
        pRVar20 = pRVar22 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<RecoveredBuffer*,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                  (pRVar22,pRVar20);
        for (; pRVar20 != pRVar5; pRVar20 = pRVar20 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<RecoveredBuffer*,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>>,__gnu_cxx::__ops::_Val_comp_iter<main::__0>>
                    ();
        }
      }
    }
    local_1030._0_8_ = (pointer)0x0;
    if (local_10a8.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_10a8.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_11e8 = local_10a8.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      pRVar20 = local_10a8.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pRVar22 = local_10a8.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar14 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          name = (RecoveredBuffer *)local_11d8;
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,
                     (string *)local_11d8);
          if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
            operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
        if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
          if (main::_binlog_sid_10.super___atomic_base<unsigned_long>._M_i == 0) {
            if ((char)in_FS_OFFSET[-1] == '\0') {
              pSVar14 = binlog::default_session();
              binlog::detail::this_thread_id_string_abi_cxx11_();
              name = (RecoveredBuffer *)local_11d8;
              binlog::SessionWriter::SessionWriter
                        ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,
                         (string *)local_11d8);
              if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
                operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
              }
              __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                  &__dso_handle);
              *(undefined1 *)(in_FS_OFFSET + -1) = 1;
            }
            ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
            local_ec0._0_8_ = 0;
            local_ec0._8_2_ = info;
            local_eb0._M_p = (pointer)&local_ea0;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_eb0,"main","");
            local_e90._M_p = (pointer)&local_e80;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_e90,"main","");
            local_e70._M_p = (pointer)&local_e60;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e70,
                       "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                       ,"");
            local_e50 = 0x150;
            local_e48._M_p = (pointer)&local_e38;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e48,"Write {} bytes of recovered {} to output at offset {}",
                       "");
            local_f78._0_2_ = 0x4c;
            mserialize::CustomTag<BufferType,_void>::tag_string();
            pRVar20 = local_11e8;
            local_1218._0_2_ = 0x4c;
            mserialize::cx_strcat<1ul,33ul,1ul>
                      ((cx_string<35UL> *)local_11d8,(mserialize *)local_f78,
                       (cx_string<1UL> *)local_940,(cx_string<33UL> *)local_1218,
                       (cx_string<1UL> *)name);
            local_e28._M_p = (pointer)&local_e18;
            sVar9 = strlen((char *)local_11d8);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e28,(RecoveredBuffer *)local_11d8,local_11d8 + sVar9);
            iVar8 = pthread_mutex_lock(ppVar1);
            if (iVar8 != 0) goto LAB_0010849c;
            local_ec0._0_8_ = ppVar1[3].__align;
            binlog::
            serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                      ((EventSource *)local_ec0,
                       (RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
            _Var13._M_i = ppVar1[3].__align;
            ppVar1[3].__align = _Var13._M_i + 1;
            pthread_mutex_unlock(ppVar1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e28._M_p != &local_e18) {
              operator_delete(local_e28._M_p,local_e18._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e48._M_p != &local_e38) {
              operator_delete(local_e48._M_p,local_e38._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e70._M_p != &local_e60) {
              operator_delete(local_e70._M_p,local_e60._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e90._M_p != &local_e80) {
              operator_delete(local_e90._M_p,local_e80._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_eb0._M_p != &local_ea0) {
              operator_delete(local_eb0._M_p,local_ea0._M_allocated_capacity + 1);
            }
            LOCK();
            UNLOCK();
            main::_binlog_sid_10.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var13._M_i;
          }
          aVar3.super___atomic_base<unsigned_long>._M_i =
               main::_binlog_sid_10.super___atomic_base<unsigned_long>._M_i;
          if ((char)in_FS_OFFSET[-1] == '\0') {
            pSVar14 = binlog::default_session();
            binlog::detail::this_thread_id_string_abi_cxx11_();
            binlog::SessionWriter::SessionWriter
                      ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,
                       (string *)local_11d8);
            if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
              operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
            }
            __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                &__dso_handle);
            *(undefined1 *)(in_FS_OFFSET + -1) = 1;
          }
          local_11d8._0_8_ = (pointer)0x0;
          local_11d8._8_8_ = 0;
          clock_gettime(0,(timespec *)local_11d8);
          lVar17 = local_11d8._0_8_ * 1000000000;
          local_11d8._0_8_ =
               *(long *)((long)&pRVar22->buffer + 8) -
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&pRVar22->buffer)->_M_allocated_capacity;
          name = pRVar22;
          binlog::SessionWriter::addEvent<unsigned_long,BufferType_const&,unsigned_long&>
                    (local_11e0,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                     lVar17 + local_11d8._8_8_,(unsigned_long *)local_11d8,&pRVar22->type,
                     (unsigned_long *)local_1030);
        }
        anon_unknown.dwarf_1eb68::printLogs();
        std::ostream::write((char *)pRVar21,
                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)&pRVar22->buffer)->_M_allocated_capacity);
        local_1030._0_8_ =
             local_1030._0_8_ +
             (*(long *)((long)&pRVar22->buffer + 8) -
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&pRVar22->buffer)->_M_allocated_capacity);
        if (((byte)local_1048[*(long *)(*(long *)pRVar21 + -0x18)] & 5) != 0) {
          if ((char)in_FS_OFFSET[-1] == '\0') {
            pSVar14 = binlog::default_session();
            binlog::detail::this_thread_id_string_abi_cxx11_();
            binlog::SessionWriter::SessionWriter
                      ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,
                       (string *)local_11d8);
            if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
              operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
            }
            __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                &__dso_handle);
            *(undefined1 *)(in_FS_OFFSET + -1) = 1;
          }
          if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x201) {
            if (main::_binlog_sid_11.super___atomic_base<unsigned_long>._M_i == 0) {
              if ((char)in_FS_OFFSET[-1] == '\0') {
                pSVar14 = binlog::default_session();
                binlog::detail::this_thread_id_string_abi_cxx11_();
                binlog::SessionWriter::SessionWriter
                          ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,
                           (string *)local_11d8);
                if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
                  operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
                }
                __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                    &__dso_handle);
                *(undefined1 *)(in_FS_OFFSET + -1) = 1;
              }
              ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
              local_718._0_8_ = 0;
              local_718._8_2_ = error;
              local_708._M_p = (pointer)&local_6f8;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"main","");
              local_6e8._M_p = (pointer)&local_6d8;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"main","");
              local_6c8._M_p = (pointer)&local_6b8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_6c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                         ,"");
              local_6a8 = 0x156;
              local_6a0._M_p = (pointer)&local_690;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_6a0,"Failure while writing output","");
              local_11d8._0_8_ = local_11d8._0_8_ & 0xffffffffffffff00;
              local_680._M_p = (pointer)&local_670;
              sVar9 = strlen(local_11d8);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_680,local_11d8,local_11d8 + sVar9);
              iVar8 = pthread_mutex_lock(ppVar1);
              if (iVar8 != 0) goto LAB_001084e9;
              local_718._0_8_ = ppVar1[3].__align;
              binlog::
              serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                        ((EventSource *)local_718,
                         (RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
              _Var13._M_i = ppVar1[3].__align;
              ppVar1[3].__align = _Var13._M_i + 1;
              pthread_mutex_unlock(ppVar1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_680._M_p != &local_670) {
                operator_delete(local_680._M_p,local_670._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6a0._M_p != &local_690) {
                operator_delete(local_6a0._M_p,local_690._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6c8._M_p != &local_6b8) {
                operator_delete(local_6c8._M_p,local_6b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6e8._M_p != &local_6d8) {
                operator_delete(local_6e8._M_p,local_6d8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_708._M_p != &local_6f8) {
                operator_delete(local_708._M_p,local_6f8._M_allocated_capacity + 1);
              }
              LOCK();
              UNLOCK();
              main::_binlog_sid_11.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var13._M_i;
            }
            aVar3.super___atomic_base<unsigned_long>._M_i =
                 main::_binlog_sid_11.super___atomic_base<unsigned_long>._M_i;
            if ((char)in_FS_OFFSET[-1] == '\0') {
              pSVar14 = binlog::default_session();
              binlog::detail::this_thread_id_string_abi_cxx11_();
              binlog::SessionWriter::SessionWriter
                        ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,
                         (string *)local_11d8);
              if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
                operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
              }
              __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                  &__dso_handle);
              *(undefined1 *)(in_FS_OFFSET + -1) = 1;
            }
            local_11d8._0_8_ = (pointer)0x0;
            local_11d8._8_8_ = 0;
            clock_gettime(0,(timespec *)local_11d8);
            binlog::SessionWriter::addEvent<>
                      (local_11e0,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                       local_11d8._0_8_ * 1000000000 + local_11d8._8_8_);
          }
          iVar8 = 4;
          anon_unknown.dwarf_1eb68::printLogs();
          goto LAB_0010798a;
        }
        pRVar22 = pRVar22 + 1;
      } while (pRVar22 != pRVar20);
    }
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar14 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)local_11d8);
      if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
        operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_12.super___atomic_base<unsigned_long>._M_i == 0) {
        pSVar12 = binlog::default_thread_local_writer();
        pSVar14 = pSVar12->_session;
        local_4f0._0_8_ = 0;
        local_4f0._8_2_ = info;
        local_4e0._M_p = local_4d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"main","");
        local_4c0._M_p = local_4b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"main","");
        local_4a0._M_p = local_490;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                   ,"");
        local_480 = 0x15c;
        local_478._M_p = local_468;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_478,"Done writing output","");
        local_11d8._0_8_ = local_11d8._0_8_ & 0xffffffffffffff00;
        local_458._M_p = local_448;
        sVar9 = strlen(local_11d8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_458,local_11d8,local_11d8 + sVar9);
        _Var13._M_i = binlog::Session::addEventSource(pSVar14,(EventSource *)local_4f0);
        binlog::EventSource::~EventSource((EventSource *)local_4f0);
        LOCK();
        UNLOCK();
        main::_binlog_sid_12.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var13._M_i;
      }
      aVar3.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_12.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar14 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)local_11d8)
        ;
        if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
          operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      local_11d8._0_8_ = (pointer)0x0;
      local_11d8._8_8_ = 0;
      clock_gettime(0,(timespec *)local_11d8);
      binlog::SessionWriter::addEvent<>
                (local_11e0,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                 local_11d8._0_8_ * 1000000000 + local_11d8._8_8_);
    }
    iVar8 = 0;
    anon_unknown.dwarf_1eb68::printLogs();
LAB_0010798a:
    std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>::~vector(&local_10a8);
  }
  else {
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar14 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)local_11d8);
      if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
        operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    }
    lVar17 = *in_FS_OFFSET;
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x201) {
      if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar14 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,
                     (string *)local_11d8);
          if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
            operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_9f8._0_8_ = 0;
        local_9f8._8_2_ = error;
        local_9e8._M_p = (pointer)&local_9d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_9e8,"main","");
        local_9c8._M_p = (pointer)&local_9b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_9c8,"main","");
        local_9a8._M_p = (pointer)&local_998;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_9a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                   ,"");
        local_988 = 0x108;
        local_980._M_p = (pointer)&local_970;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_980,"Failed to open {} for writing","");
        local_940[0].type._0_2_ = 0x5b;
        local_1030._0_2_ = 99;
        cVar7 = mserialize::cx_strcat<1ul,1ul>
                          ((cx_string<1UL> *)local_940,(cx_string<1UL> *)local_1030);
        local_11d8._0_8_ = CONCAT53(local_11d8._3_5_,cVar7._data) & 0xffffffffff00ffff;
        local_960._M_p = (pointer)&local_950;
        sVar9 = strlen(local_11d8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_960,local_11d8,local_11d8 + sVar9);
        iVar8 = pthread_mutex_lock(ppVar1);
        if (iVar8 != 0) goto LAB_001084cd;
        local_9f8._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_9f8,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var13._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var13._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_960._M_p != &local_950) {
          operator_delete(local_960._M_p,local_950._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_980._M_p != &local_970) {
          operator_delete(local_980._M_p,local_970._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9a8._M_p != &local_998) {
          operator_delete(local_9a8._M_p,local_998._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9c8._M_p != &local_9b8) {
          operator_delete(local_9c8._M_p,local_9b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9e8._M_p != &local_9d8) {
          operator_delete(local_9e8._M_p,local_9d8._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var13._M_i;
      }
      aVar3.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar14 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar14,0x100000,0,(string *)local_11d8)
        ;
        if ((undefined1 *)local_11d8._0_8_ != local_11d8 + 0x10) {
          operator_delete((void *)local_11d8._0_8_,(ulong)(local_11d8._16_8_ + 1));
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      local_11d8._0_8_ = (pointer)0x0;
      local_11d8._8_8_ = 0;
      clock_gettime(0,(timespec *)local_11d8);
      binlog::SessionWriter::addEvent<char_const*&>
                ((SessionWriter *)(lVar17 + -0x38),
                 (uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                 local_11d8._0_8_ * 1000000000 + local_11d8._8_8_,argv + 2);
    }
    anon_unknown.dwarf_1eb68::printLogs();
    iVar8 = 3;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "brecovery -- extract unconsumed binlog data from a memory dump\n\nSynopsis:\n  brecovery corefile [outputfile]\n\nArguments:\n  corefile        Path to a corefile (memory dump)\n  outputfile      Path to write recovered data. If \'-\' or unspecified, read from stdin\n\nNotes:\n  Recovery is done by looking for \'magic numbers\' in the corefile,\n  and extracting structured data following those. Metadata and unconsumed data\n  are extracted from each session, and written to the output.\n  The output is a valid binlog logfile (if it was not corrupted previously),\n  and can be read using bread:\n\n    $ brecovery app.core recovered.blog\n    $ bread recovered.blog\n\nReport bugs to:\n  https://github.com/Morgan-Stanley/binlog/issues\n"
               ,0x2cd);
  }
  local_438 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_438 + *(long *)(_VTT->_M_local_buf + -0x18)) = _strftime;
  std::filebuf::~filebuf((filebuf *)&uStack_430);
  std::ios_base::~ios_base(local_340);
  if (local_ad0[0] != local_ac0) {
    operator_delete(local_ad0[0],local_ac0[0] + 1);
  }
LAB_001079f0:
  std::ifstream::~ifstream(local_238);
  return iVar8;
LAB_0010849c:
  iVar8 = std::__throw_system_error(iVar8);
LAB_001084a3:
  iVar8 = std::__throw_system_error(iVar8);
LAB_001084aa:
  iVar8 = std::__throw_system_error(iVar8);
LAB_001084b1:
  iVar8 = std::__throw_system_error(iVar8);
LAB_001084b8:
  iVar8 = std::__throw_system_error(iVar8);
LAB_001084bf:
  iVar8 = std::__throw_system_error(iVar8);
LAB_001084c6:
  iVar8 = std::__throw_system_error(iVar8);
LAB_001084cd:
  iVar8 = std::__throw_system_error(iVar8);
LAB_001084d4:
  iVar8 = std::__throw_system_error(iVar8);
LAB_001084db:
  iVar8 = std::__throw_system_error(iVar8);
  goto LAB_001084e2;
}

Assistant:

int main(int argc, const char* argv[])
{
  if (argc < 2)
  {
    showHelp();
    return 1;
  }

  std::ifstream input(argv[1], std::ios_base::in|std::ios_base::binary);
  if (! input)
  {
    STDERR_ERROR("Failed to open {} for reading", argv[1]);
    showHelp();
    return 2;
  }

  const std::string outputPath = (argc > 2) ? argv[2] : "-";
  std::ofstream outputFile;
  std::ostream& output = openFile(outputPath, outputFile);
  if (! output)
  {
    STDERR_ERROR("Failed to open {} for writing", argv[2]);
    showHelp();
    return 3;
  }

  std::vector<RecoveredBuffer> buffers;

  // do not initialize arrays directly to remain endianness agnostic
  const std::array<unsigned char, 8> metadataMagic = toArray(0xFE214F726E35BDBC);
  const std::array<unsigned char, 8> dataMagic = toArray(0xFE213F716D34BCBC);

  // magic numbers start with the same byte, makes searching easier
  assert(metadataMagic[0] == dataMagic[0]);
  const unsigned char firstMagicByte = metadataMagic[0];

  STDERR_INFO("Read input from {}", argv[1]);

  while (input.ignore(std::numeric_limits<std::streamsize>::max(), firstMagicByte).good())
  {
    std::array<unsigned char, 8> magic{firstMagicByte, 0, 0, 0, 0, 0, 0, 0};
    input.read(reinterpret_cast<char*>(magic.data()+1), 7);

    const auto afterMagicPos = std::streamoff{input.tellg()};

    if (magic == metadataMagic)
    {
      STDERR_INFO("Magic number found, read metadata at tellg={}", afterMagicPos);
      if (! readMetadata(input, buffers))
      {
        STDERR_ERROR("  Failed to read metadata, continue searching at tellg={}", afterMagicPos);
        input.clear();
        input.seekg(afterMagicPos);
      }
    }
    else if (magic == dataMagic)
    {
      STDERR_INFO("Magic number found, read data at tellg={}", afterMagicPos);
      if (! readData(input, buffers))
      {
        STDERR_ERROR("  Failed to read data, continue searching at tellg={}", afterMagicPos);
        input.clear();
        input.seekg(afterMagicPos);
      }
    }
    else
    {
      // not a magic number, seek back
      input.seekg(-7, std::ios_base::cur);
    }
  }

  if (input.eof())
  {
    STDERR_INFO("Done reading input");
  }
  else
  {
    STDERR_ERROR("Failure while reading input, continue anyway");
  }

  STDERR_INFO("Write output");

  // make sure metadata precedes data, and everything is grouped by sessions
  const auto cmp = [](auto&& a, auto&& b)
  {
    return a.session == b.session ? a.type < b.type : a.session < b.session;
  };
  std::sort(buffers.begin(), buffers.end(), cmp);

  std::size_t offset = 0;
  for (const RecoveredBuffer& buffer : buffers)
  {
    STDERR_INFO("Write {} bytes of recovered {} to output at offset {}", buffer.buffer.size(), buffer.type, offset);
    output.write(buffer.buffer.data(), std::streamsize(buffer.buffer.size()));
    offset += buffer.buffer.size();

    if (! output)
    {
      STDERR_ERROR("Failure while writing output");
      return 4;

    }
  }

  STDERR_INFO("Done writing output");

  return 0;
}